

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::info<char[18],std::__cxx11::string>
          (ConsoleLogger *this,char (*args) [18],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  char (*in_RDX) [18];
  ConsoleLogger *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  if (*(int *)((long)&in_RDI[3]._M_string_length + 4) < 2) {
    std::mutex::lock((mutex *)in_RDI);
    if ((in_RDI[3]._M_string_length & 1) != 0) {
      std::operator<<(*(ostream **)in_RDI,(string *)&in_RDI->_M_string_length);
    }
    std::operator<<(*(ostream **)in_RDI,"[i] ");
    if ((in_RDI[3]._M_string_length & 1) != 0) {
      std::operator<<(*(ostream **)in_RDI,"\x1b[0m");
    }
    print<char[18],std::__cxx11::string>(in_RSI,in_RDX,in_RDI);
    std::mutex::unlock((mutex *)0x11025d);
  }
  return;
}

Assistant:

void ConsoleLogger::info(const Args&... args)
{
	if (loglevel > 1) return;
	mtx.lock();
	if (colored) out << infoColor;
	out << "[i] ";
	if (colored) out << "\033[0m";
	print(args...);
	mtx.unlock();
}